

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinChar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 uVar4;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  long in_RDI;
  Value VVar5;
  char32_t c;
  stringstream ss_1;
  stringstream ss;
  long l;
  UString *in_stack_fffffffffffffb68;
  Interpreter *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffb80;
  undefined1 *__n;
  char32_t *in_stack_fffffffffffffb88;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffb90;
  allocator_type *in_stack_fffffffffffffb98;
  allocator<char> *in_stack_fffffffffffffba0;
  iterator in_stack_fffffffffffffba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  undefined1 local_419 [33];
  Type local_3f8;
  undefined4 uStack_3f4;
  anon_union_8_3_4e909c26_for_v local_3f0;
  undefined4 local_3e8;
  undefined1 local_3e1;
  stringstream local_3c0 [16];
  ostream local_3b0 [383];
  undefined1 local_231;
  stringstream local_210 [16];
  ostream local_200 [80];
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffe50;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  LocationRange *in_stack_fffffffffffffe68;
  Interpreter *in_stack_fffffffffffffe70;
  undefined4 local_88;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  allocator<char> local_39;
  string local_38 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  local_7c = 2;
  local_78 = &local_7c;
  local_70 = 1;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2ce41c);
  __l._M_len = (size_type)in_stack_fffffffffffffbb0;
  __l._M_array = in_stack_fffffffffffffba8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)in_stack_fffffffffffffba0,__l,in_stack_fffffffffffffb98);
  validateBuiltinArgs(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                      in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector(in_stack_fffffffffffffb80);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2ce480);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  pvVar1 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_18,0);
  lVar2 = (long)(pvVar1->v).d;
  if (lVar2 < 0) {
    std::__cxx11::stringstream::stringstream(local_210);
    poVar3 = std::operator<<(local_200,"codepoints must be >= 0, got ");
    std::ostream::operator<<(poVar3,lVar2);
    local_231 = 1;
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError((Interpreter *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
              (LocationRange *)in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
    local_231 = 0;
    __cxa_throw(uVar4,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (0x10ffff < lVar2) {
    std::__cxx11::stringstream::stringstream(local_3c0);
    poVar3 = std::operator<<(local_3b0,"invalid unicode codepoint, got ");
    std::ostream::operator<<(poVar3,lVar2);
    local_3e1 = 1;
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError((Interpreter *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
              (LocationRange *)in_stack_fffffffffffffb70,(string *)in_stack_fffffffffffffb68);
    local_3e1 = 0;
    __cxa_throw(uVar4,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  local_88 = (undefined4)lVar2;
  local_3e8 = local_88;
  __n = local_419;
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2ce7d2);
  std::__cxx11::u32string::u32string
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,(size_type)__n,
             (allocator<char32_t> *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  VVar5 = makeString(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  local_3f0 = VVar5.v;
  local_3f8 = VVar5.t;
  *(ulong *)(in_RDI + 0x40) = CONCAT44(uStack_3f4,local_3f8);
  ((anon_union_8_3_4e909c26_for_v *)(in_RDI + 0x48))->h = (HeapEntity *)local_3f0;
  std::__cxx11::u32string::~u32string
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_3f0.h);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2ce85c);
  return (AST *)0x0;
}

Assistant:

const AST *builtinChar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "char", args, {Value::NUMBER});
        long l = long(args[0].v.d);
        if (l < 0) {
            std::stringstream ss;
            ss << "codepoints must be >= 0, got " << l;
            throw makeError(loc, ss.str());
        }
        if (l >= JSONNET_CODEPOINT_MAX) {
            std::stringstream ss;
            ss << "invalid unicode codepoint, got " << l;
            throw makeError(loc, ss.str());
        }
        char32_t c = l;
        scratch = makeString(UString(&c, 1));
        return nullptr;
    }